

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O0

void pbrt::detail::
     stringPrintfRecursive<pbrt::FloatTextureHandle_const&,float_const&,pbrt::SpectrumTextureHandle_const&,pbrt::SpectrumTextureHandle_const&,pbrt::SpectrumTextureHandle_const&,pbrt::SpectrumTextureHandle_const&,pbrt::FloatTextureHandle_const&,pbrt::FloatTextureHandle_const&,float_const&,bool_const&>
               (string *s,char *fmt,FloatTextureHandle *v,float *args,SpectrumTextureHandle *args_1,
               SpectrumTextureHandle *args_2,SpectrumTextureHandle *args_3,
               SpectrumTextureHandle *args_4,FloatTextureHandle *args_5,FloatTextureHandle *args_6,
               float *args_7,bool *args_8)

{
  long lVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  SpectrumTextureHandle *in_RCX;
  SpectrumTextureHandle *in_RDX;
  char *unaff_RBX;
  SpectrumTextureHandle *in_RSI;
  string *in_RDI;
  string *unaff_R14;
  SpectrumTextureHandle *in_stack_00000010;
  FloatTextureHandle *in_stack_00000018;
  FloatTextureHandle *in_stack_00000020;
  float *in_stack_00000028;
  bool *in_stack_00000030;
  stringstream ss;
  bool isDFmt;
  bool isSFmt;
  bool precisionViaArg;
  string nextFmt;
  FloatTextureHandle *in_stack_fffffffffffffd60;
  char *in_stack_fffffffffffffd68;
  string *in_stack_fffffffffffffd80;
  char **in_stack_fffffffffffffd88;
  char **in_stack_fffffffffffffd90;
  FloatTextureHandle *in_stack_fffffffffffffd98;
  ostream *in_stack_fffffffffffffda0;
  string local_250 [32];
  undefined8 local_230;
  string local_228 [32];
  char *in_stack_fffffffffffffdf8;
  int in_stack_fffffffffffffe04;
  char *in_stack_fffffffffffffe08;
  LogLevel in_stack_fffffffffffffe14;
  string local_68 [48];
  
  copyToFormatString(in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
  lVar1 = std::__cxx11::string::find((char)local_68,0x2a);
  lVar2 = std::__cxx11::string::find((char)local_68,0x73);
  lVar3 = std::__cxx11::string::find((char)local_68,100);
  if (lVar1 != -1) {
    LogFatal(in_stack_fffffffffffffe14,in_stack_fffffffffffffe08,in_stack_fffffffffffffe04,
             in_stack_fffffffffffffdf8);
  }
  if (lVar3 != -1) {
    LogFatal(in_stack_fffffffffffffe14,in_stack_fffffffffffffe08,in_stack_fffffffffffffe04,
             in_stack_fffffffffffffdf8);
  }
  if (lVar2 == -1) {
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) != 0) {
      LogFatal(in_stack_fffffffffffffe14,in_stack_fffffffffffffe08,in_stack_fffffffffffffe04,
               in_stack_fffffffffffffdf8);
    }
    std::__cxx11::string::c_str();
    formatOne<pbrt::FloatTextureHandle_const&>(in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
    std::__cxx11::string::operator+=(in_RDI,(string *)&stack0xfffffffffffffd90);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffd90);
  }
  else {
    std::__cxx11::stringstream::stringstream((stringstream *)&stack0xfffffffffffffdf8);
    pbrt::operator<<(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
    std::__cxx11::string::c_str();
    std::__cxx11::stringstream::str();
    local_230 = std::__cxx11::string::c_str();
    formatOne<char_const*>((char *)in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
    std::__cxx11::string::operator+=(in_RDI,local_228);
    std::__cxx11::string::~string(local_228);
    std::__cxx11::string::~string(local_250);
    std::__cxx11::stringstream::~stringstream((stringstream *)&stack0xfffffffffffffdf8);
  }
  stringPrintfRecursive<float_const&,pbrt::SpectrumTextureHandle_const&,pbrt::SpectrumTextureHandle_const&,pbrt::SpectrumTextureHandle_const&,pbrt::SpectrumTextureHandle_const&,pbrt::FloatTextureHandle_const&,pbrt::FloatTextureHandle_const&,float_const&,bool_const&>
            (unaff_R14,unaff_RBX,(float *)in_RDI,in_RSI,in_RDX,in_RCX,in_stack_00000010,
             in_stack_00000018,in_stack_00000020,in_stack_00000028,in_stack_00000030);
  std::__cxx11::string::~string(local_68);
  return;
}

Assistant:

inline void stringPrintfRecursive(std::string *s, const char *fmt, T &&v,
                                  Args &&... args) {
    std::string nextFmt = copyToFormatString(&fmt, s);
    bool precisionViaArg = nextFmt.find('*') != std::string::npos;

    bool isSFmt = nextFmt.find('s') != std::string::npos;
    bool isDFmt = nextFmt.find('d') != std::string::npos;

    if constexpr (std::is_integral<std::decay_t<T>>::value) {
        if (precisionViaArg) {
            stringPrintfRecursiveWithPrecision(s, fmt, nextFmt, v,
                                               std::forward<Args>(args)...);
            return;
        }
    } else if (precisionViaArg)
        LOG_FATAL("Non-integral type provided for %* format.");

    if constexpr (std::is_same<std::decay_t<T>, float>::value)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::FloatToString(v);
            goto done;
        }

    if constexpr (std::is_same<std::decay_t<T>, double>::value)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::DoubleToString(v);
            goto done;
        }

    if constexpr (std::is_same<std::decay_t<T>, bool>::value)  // FIXME: %-10s with bool
        if (isSFmt) {
            *s += bool(v) ? "true" : "false";
            goto done;
        }

    if constexpr (std::is_integral<std::decay_t<T>>::value) {
        if (isDFmt) {
            nextFmt.replace(nextFmt.find('d'), 1,
                            detail::IntegerFormatTrait<std::decay_t<T>>::fmt());
            *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
            goto done;
        }
    } else if (isDFmt)
        LOG_FATAL("Non-integral type passed to %d format.");

    if (isSFmt) {
        std::stringstream ss;
        ss << v;
        *s += formatOne(nextFmt.c_str(), ss.str().c_str());
    } else if (!nextFmt.empty())
        *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
    else
        LOG_FATAL("Excess values passed to Printf.");

done:
    stringPrintfRecursive(s, fmt, std::forward<Args>(args)...);
}